

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O2

void uv__chld(uv_signal_t *handle,int signum)

{
  uint uVar1;
  uv_loop_t *puVar2;
  long *plVar3;
  long lVar4;
  void **ppvVar5;
  __pid_t _Var6;
  int *piVar7;
  uint uVar8;
  char *__assertion;
  long *plVar9;
  void **ppvVar10;
  int status;
  QUEUE pending;
  
  if (signum == 0x11) {
    puVar2 = handle->loop;
    plVar3 = (long *)puVar2->process_handles[0];
    pending[0] = pending;
    pending[1] = pending;
LAB_004f9a50:
    do {
      plVar9 = plVar3;
      ppvVar5 = (void **)pending[0];
      if ((void **)plVar9 == puVar2->process_handles) goto LAB_004f9ac2;
      plVar3 = (long *)*plVar9;
      do {
        _Var6 = waitpid((__pid_t)plVar9[-1],&status,1);
        if (_Var6 != -1) {
          if (_Var6 != 0) {
            *(int *)(plVar9 + 2) = status;
            lVar4 = *plVar9;
            *(long *)plVar9[1] = lVar4;
            *(long *)(lVar4 + 8) = plVar9[1];
            *plVar9 = (long)pending;
            plVar9[1] = (long)pending[1];
            *(long **)pending[1] = plVar9;
            pending[1] = plVar9;
          }
          goto LAB_004f9a50;
        }
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      if (*piVar7 != 10) {
        abort();
      }
    } while( true );
  }
  __assertion = "signum == SIGCHLD";
  uVar1 = 0x3b;
LAB_004f9b80:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                ,uVar1,"void uv__chld(uv_signal_t *, int)");
LAB_004f9ac2:
  while (ppvVar10 = ppvVar5, ppvVar10 != pending) {
    ppvVar5 = (void **)*ppvVar10;
    *(void ***)ppvVar10[1] = ppvVar5;
    ppvVar5[1] = ppvVar10[1];
    *ppvVar10 = ppvVar10;
    ppvVar10[1] = ppvVar10;
    uVar1 = *(uint *)(ppvVar10 + -3);
    if (((uVar1 >> 0xe & 1) != 0) &&
       (*(uint *)(ppvVar10 + -3) = uVar1 & 0xffffbfff, (uVar1 >> 0xd & 1) != 0)) {
      *(int *)((long)ppvVar10[-0xd] + 8) = *(int *)((long)ppvVar10[-0xd] + 8) + -1;
    }
    if ((code *)ppvVar10[-2] != (code *)0x0) {
      uVar8 = *(uint *)(ppvVar10 + 2) & 0x7f;
      uVar1 = *(uint *)(ppvVar10 + 2) >> 8 & 0xff;
      if (uVar8 != 0) {
        uVar1 = 0;
      }
      if ((int)(uVar8 * 0x1000000 + 0x1000000) < 0x2000000) {
        uVar8 = 0;
      }
      (*(code *)ppvVar10[-2])(ppvVar10 + -0xe,uVar1,uVar8);
    }
  }
  if (pending == (void **)pending[0]) {
    return;
  }
  __assertion = "QUEUE_EMPTY(&pending)";
  uVar1 = 0x6f;
  goto LAB_004f9b80;
}

Assistant:

static void uv__chld(uv_signal_t* handle, int signum) {
  uv_process_t* process;
  uv_loop_t* loop;
  int exit_status;
  int term_signal;
  int status;
  pid_t pid;
  QUEUE pending;
  QUEUE* q;
  QUEUE* h;

  assert(signum == SIGCHLD);

  QUEUE_INIT(&pending);
  loop = handle->loop;

  h = &loop->process_handles;
  q = QUEUE_HEAD(h);
  while (q != h) {
    process = QUEUE_DATA(q, uv_process_t, queue);
    q = QUEUE_NEXT(q);

    do
      pid = waitpid(process->pid, &status, WNOHANG);
    while (pid == -1 && errno == EINTR);

    if (pid == 0)
      continue;

    if (pid == -1) {
      if (errno != ECHILD)
        abort();
      continue;
    }

    process->status = status;
    QUEUE_REMOVE(&process->queue);
    QUEUE_INSERT_TAIL(&pending, &process->queue);
  }

  h = &pending;
  q = QUEUE_HEAD(h);
  while (q != h) {
    process = QUEUE_DATA(q, uv_process_t, queue);
    q = QUEUE_NEXT(q);

    QUEUE_REMOVE(&process->queue);
    QUEUE_INIT(&process->queue);
    uv__handle_stop(process);

    if (process->exit_cb == NULL)
      continue;

    exit_status = 0;
    if (WIFEXITED(process->status))
      exit_status = WEXITSTATUS(process->status);

    term_signal = 0;
    if (WIFSIGNALED(process->status))
      term_signal = WTERMSIG(process->status);

    process->exit_cb(process, exit_status, term_signal);
  }
  assert(QUEUE_EMPTY(&pending));
}